

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int fftsud(fitsfile *mfptr,HDUtracker *HDU,int newPosition,char *newFileName)

{
  int iVar1;
  char *in_RCX;
  int in_EDX;
  int *in_RSI;
  fitsfile *in_RDI;
  bool bVar2;
  char filename2 [1025];
  char filename1 [1025];
  int status;
  int hdunum;
  int i;
  char *in_stack_fffffffffffff7a8;
  undefined6 in_stack_fffffffffffff7b0;
  undefined1 in_stack_fffffffffffff7b6;
  undefined1 in_stack_fffffffffffff7b7;
  char local_848 [1104];
  int *in_stack_fffffffffffffc08;
  char *in_stack_fffffffffffffc10;
  char *in_stack_fffffffffffffc18;
  int local_2c;
  int local_28;
  int local_24;
  char *local_20;
  int local_14;
  int *local_10;
  
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  ffghdn(in_RDI,&local_28);
  ffflnm((fitsfile *)
         CONCAT17(in_stack_fffffffffffff7b7,
                  CONCAT16(in_stack_fffffffffffff7b6,in_stack_fffffffffffff7b0)),
         in_stack_fffffffffffff7a8,(int *)0x1efe13);
  local_2c = ffrtnm(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  local_24 = 0;
  while( true ) {
    bVar2 = false;
    if (local_24 < *local_10) {
      bVar2 = false;
      if (local_10[(long)local_24 + 0x7d2] == local_28) {
        iVar1 = strcmp(*(char **)(local_10 + (long)local_24 * 2 + 2),local_848);
        bVar2 = iVar1 == 0;
      }
      bVar2 = (bool)(bVar2 ^ 1);
    }
    if (!bVar2) break;
    local_24 = local_24 + 1;
  }
  if (local_24 == *local_10) {
    local_2c = 0x156;
  }
  else {
    if (local_14 != 0) {
      local_10[(long)local_24 + 0x138a] = local_14;
    }
    if (local_20 != (char *)0x0) {
      strcpy(*(char **)(local_10 + (long)local_24 * 2 + 0xbba),local_20);
    }
  }
  return local_2c;
}

Assistant:

int fftsud(fitsfile   *mfptr,       /* pointer to an member HDU             */
	   HDUtracker *HDU,         /* pointer to an HDU tracker struct     */
	   int         newPosition, /* new HDU position of the member HDU   */
	   char       *newFileName) /* file containing member HDU           */

/*
  update the HDU information in the HDUtracker struct pointed to by HDU. The 
  HDU to update is pointed to by mfptr. If non-zero, the value of newPosition
  is used to update the HDU->newPosition[] value for the mfptr, and if
  non-NULL the newFileName value is used to update the HDU->newFilename[]
  value for mfptr.
*/

{
  int i;
  int hdunum;
  int status = 0;

  char filename1[FLEN_FILENAME];
  char filename2[FLEN_FILENAME];


  /* retrieve the HDU's position within the FITS file */
  
  fits_get_hdu_num(mfptr,&hdunum);
  
  /* retrieve the HDU's file name */
  
  status = fits_file_name(mfptr,filename1,&status);
  
  /* parse the file name and construct the "standard" URL for it */
      
  status = ffrtnm(filename1,filename2,&status);

  /* 
     examine all the existing HDUs in the HDUtracker an see if this HDU
     has already been registered
  */

  for(i = 0; i < HDU->nHDU && 
      !(HDU->position[i] == hdunum && strcmp(HDU->filename[i],filename2) == 0);
      ++i);

  /* if previously registered then change newPosition and newFileName */

  if(i != HDU->nHDU) 
    {
      if(newPosition  != 0) HDU->newPosition[i] = newPosition;
      if(newFileName  != NULL) 
	{
	  strcpy(HDU->newFilename[i],newFileName);
	}
    }
  else
    status = MEMBER_NOT_FOUND;
 
  return(status);
}